

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int initScan(ENCODING **encodingTable,INIT_ENCODING *enc,int state,char *ptr,char *end,
            char **nextTokPtr)

{
  byte bVar1;
  ENCODING *pEVar2;
  ENCODING *pEVar3;
  ushort uVar4;
  int iVar5;
  normal_encoding *pnVar6;
  undefined4 in_register_00000014;
  byte *ptr_00;
  
  ptr_00 = (byte *)CONCAT44(in_register_00000014,state);
  if (ptr <= ptr_00) {
    return -4;
  }
  pEVar2 = encodingTable[0x10];
  iVar5 = (int)enc;
  if (ptr_00 + 1 == (byte *)ptr) {
    if (iVar5 != 1) {
      return -1;
    }
    if ((byte)(*(char *)((long)encodingTable + 0x7d) - 3U) < 3) {
      return -1;
    }
    bVar1 = *ptr_00;
    if ((bVar1 - 0xef < 0x11) && ((0x18001U >> (bVar1 - 0xef & 0x1f) & 1) != 0)) {
      if (*(char *)((long)encodingTable + 0x7d) != '\0') {
        return -1;
      }
    }
    else {
      if (bVar1 == 0) {
        return -1;
      }
      if (bVar1 == 0x3c) {
        return -1;
      }
    }
    goto LAB_004074b8;
  }
  uVar4 = CONCAT11(*ptr_00,ptr_00[1]);
  if (uVar4 < 0xfeff) {
    if (uVar4 == 0x3c00) {
      if (*(char *)((long)encodingTable + 0x7d) == '\x04') {
        if (iVar5 == 1) goto LAB_004074b8;
      }
      else if (iVar5 == 1 && *(char *)((long)encodingTable + 0x7d) == '\x03') goto LAB_004074b8;
      pnVar6 = &little2_encoding;
      goto LAB_0040749a;
    }
    if (uVar4 == 0xefbb) {
      if (((iVar5 != 1) || (5 < *(byte *)((long)encodingTable + 0x7d))) ||
         ((0x39U >> (*(byte *)((long)encodingTable + 0x7d) & 0x1f) & 1) == 0)) {
        if (ptr_00 + 2 == (byte *)ptr) {
          return -1;
        }
        if (ptr_00[2] == 0xbf) {
          *(byte **)end = ptr_00 + 3;
          pnVar6 = &utf8_encoding;
          goto LAB_00407463;
        }
      }
      goto LAB_004074b8;
    }
  }
  else {
    if (uVar4 == 0xfffe) {
      if ((iVar5 == 1) && (*(char *)((long)encodingTable + 0x7d) == '\0')) goto LAB_004074b8;
      *(byte **)end = ptr_00 + 2;
      pnVar6 = &little2_encoding;
LAB_00407463:
      pEVar2->scanners[0] = (SCANNER)pnVar6;
      return 0xe;
    }
    if (uVar4 == 0xfeff) {
      if ((iVar5 == 1) && (*(char *)((long)encodingTable + 0x7d) == '\0')) goto LAB_004074b8;
      *(byte **)end = ptr_00 + 2;
      pnVar6 = &big2_encoding;
      goto LAB_00407463;
    }
  }
  if (*ptr_00 == 0) {
    if ((iVar5 != 1) || (*(char *)((long)encodingTable + 0x7d) != '\x05')) {
      pnVar6 = &big2_encoding;
LAB_0040749a:
      pEVar2->scanners[0] = (SCANNER)pnVar6;
      iVar5 = (*(pnVar6->enc).scanners[(ulong)enc & 0xffffffff])
                        (&pnVar6->enc,(char *)ptr_00,ptr,(char **)end);
      return iVar5;
    }
  }
  else if (iVar5 != 1 && ptr_00[1] == 0) {
    pEVar2->scanners[0] = (SCANNER)&little2_encoding;
    iVar5 = little2_prologTok(&little2_encoding.enc,(char *)ptr_00,ptr,(char **)end);
    return iVar5;
  }
LAB_004074b8:
  pEVar3 = encodings[*(char *)((long)encodingTable + 0x7d)];
  pEVar2->scanners[0] = (SCANNER)pEVar3;
  iVar5 = (*pEVar3->scanners[(ulong)enc & 0xffffffff])(pEVar3,(char *)ptr_00,ptr,(char **)end);
  return iVar5;
}

Assistant:

static int
initScan(const ENCODING * const *encodingTable,
         const INIT_ENCODING *enc,
         int state,
         const char *ptr,
         const char *end,
         const char **nextTokPtr)
{
  const ENCODING **encPtr;

  if (ptr >= end)
    return XML_TOK_NONE;
  encPtr = enc->encPtr;
  if (ptr + 1 == end) {
    /* only a single byte available for auto-detection */
#ifndef XML_DTD /* FIXME */
    /* a well-formed document entity must have more than one byte */
    if (state != XML_CONTENT_STATE)
      return XML_TOK_PARTIAL;
#endif
    /* so we're parsing an external text entity... */
    /* if UTF-16 was externally specified, then we need at least 2 bytes */
    switch (INIT_ENC_INDEX(enc)) {
    case UTF_16_ENC:
    case UTF_16LE_ENC:
    case UTF_16BE_ENC:
      return XML_TOK_PARTIAL;
    }
    switch ((unsigned char)*ptr) {
    case 0xFE:
    case 0xFF:
    case 0xEF: /* possibly first byte of UTF-8 BOM */
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC
          && state == XML_CONTENT_STATE)
        break;
      /* fall through */
    case 0x00:
    case 0x3C:
      return XML_TOK_PARTIAL;
    }
  }
  else {
    switch (((unsigned char)ptr[0] << 8) | (unsigned char)ptr[1]) {
    case 0xFEFF:
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC
          && state == XML_CONTENT_STATE)
        break;
      *nextTokPtr = ptr + 2;
      *encPtr = encodingTable[UTF_16BE_ENC];
      return XML_TOK_BOM;
    /* 00 3C is handled in the default case */
    case 0x3C00:
      if ((INIT_ENC_INDEX(enc) == UTF_16BE_ENC
           || INIT_ENC_INDEX(enc) == UTF_16_ENC)
          && state == XML_CONTENT_STATE)
        break;
      *encPtr = encodingTable[UTF_16LE_ENC];
      return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
    case 0xFFFE:
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC
          && state == XML_CONTENT_STATE)
        break;
      *nextTokPtr = ptr + 2;
      *encPtr = encodingTable[UTF_16LE_ENC];
      return XML_TOK_BOM;
    case 0xEFBB:
      /* Maybe a UTF-8 BOM (EF BB BF) */
      /* If there's an explicitly specified (external) encoding
         of ISO-8859-1 or some flavour of UTF-16
         and this is an external text entity,
         don't look for the BOM,
         because it might be a legal data.
      */
      if (state == XML_CONTENT_STATE) {
        int e = INIT_ENC_INDEX(enc);
        if (e == ISO_8859_1_ENC || e == UTF_16BE_ENC
            || e == UTF_16LE_ENC || e == UTF_16_ENC)
          break;
      }
      if (ptr + 2 == end)
        return XML_TOK_PARTIAL;
      if ((unsigned char)ptr[2] == 0xBF) {
        *nextTokPtr = ptr + 3;
        *encPtr = encodingTable[UTF_8_ENC];
        return XML_TOK_BOM;
      }
      break;
    default:
      if (ptr[0] == '\0') {
        /* 0 isn't a legal data character. Furthermore a document
           entity can only start with ASCII characters.  So the only
           way this can fail to be big-endian UTF-16 if it it's an
           external parsed general entity that's labelled as
           UTF-16LE.
        */
        if (state == XML_CONTENT_STATE && INIT_ENC_INDEX(enc) == UTF_16LE_ENC)
          break;
        *encPtr = encodingTable[UTF_16BE_ENC];
        return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
      }
      else if (ptr[1] == '\0') {
        /* We could recover here in the case:
            - parsing an external entity
            - second byte is 0
            - no externally specified encoding
            - no encoding declaration
           by assuming UTF-16LE.  But we don't, because this would mean when
           presented just with a single byte, we couldn't reliably determine
           whether we needed further bytes.
        */
        if (state == XML_CONTENT_STATE)
          break;
        *encPtr = encodingTable[UTF_16LE_ENC];
        return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
      }
      break;
    }
  }
  *encPtr = encodingTable[INIT_ENC_INDEX(enc)];
  return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
}